

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

EdgeData *
axisEdgeData(EdgeData *__return_storage_ptr__,QTextTable *table,QTextTableData *td,
            QTextTableCell *cell,Edge edge)

{
  EdgeClass EVar1;
  EdgeData *pEVar2;
  long in_FS_OFFSET;
  EdgeData local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->width = -NAN;
  (__return_storage_ptr__->cell).table = (QTextTable *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->cell).fragment = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->edge = &DAT_aaaaaaaaaaaaaaaa;
  cellEdgeData(__return_storage_ptr__,table,td,cell,edge);
  if (td->borderCollapse == true) {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    adjacentCell((QTextTable *)local_48,(QTextTableCell *)table,(Edge)cell);
    cellEdgeData(&local_68,table,td,(QTextTableCell *)local_48,
                 *(Edge *)(&DAT_005fb5b0 + (long)(int)edge * 4));
    pEVar2 = qMax<EdgeData>(__return_storage_ptr__,&local_68);
    __return_storage_ptr__->width = pEVar2->width;
    (__return_storage_ptr__->cell).table = (pEVar2->cell).table;
    (__return_storage_ptr__->cell).fragment = (pEVar2->cell).fragment;
    EVar1 = pEVar2->edgeClass;
    __return_storage_ptr__->edge = pEVar2->edge;
    __return_storage_ptr__->edgeClass = EVar1;
    if ((QTextTable *)local_48._0_8_ != (QTextTable *)0x0) {
      pEVar2 = (EdgeData *)(*(code *)(&DAT_005fb640 + *(int *)(&DAT_005fb640 + (ulong)edge * 4)))();
      return pEVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static inline EdgeData axisEdgeData(QTextTable *table, const QTextTableData *td,
                                    const QTextTableCell &cell, QCss::Edge edge)
{
    Q_ASSERT(cell.isValid());

    EdgeData result = cellEdgeData(table, td, cell, edge);
    if (!td->borderCollapse)
        return result;

    QTextTableCell ac = adjacentCell(table, cell, edge);
    result = qMax(result, cellEdgeData(table, td, ac, adjacentEdge(edge)));

    bool mustCheckThirdCell = false;
    if (ac.isValid()) {
        /* if C0 and C3 don't share the left/top axis, we must
         * also check C1.
         *
         * C0 and C4 don't share the left axis so we have
         * to take the top edge of C1 (T1) into account
         * because this might be wider than C0's bottom
         * edge (B0). For the sake of simplicity we skip
         * checking T2 and T3.
         *
         * | C0
         * |-----|-----|----|-----
         * | C1  | C2  | C3 | C4
         *
         * width(T4) = max(T4, B0, T1) (T2 and T3 won't be checked)
         */
        switch (edge) {
        case QCss::TopEdge:
        case QCss::BottomEdge:
            mustCheckThirdCell = !sharesAxis(cell, QCss::LeftEdge, ac, QCss::LeftEdge);
            break;
        case QCss::LeftEdge:
        case QCss::RightEdge:
            mustCheckThirdCell = !sharesAxis(cell, QCss::TopEdge, ac, QCss::TopEdge);
            break;
        default:
            Q_UNREACHABLE();
            break;
        }
    }

    if (mustCheckThirdCell)
        result = qMax(result, cellEdgeData(table, td, adjacentCell(table, ac, adjacentEdge(edge)), edge));

    return result;
}